

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O1

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  int in_EDX;
  int extraout_EDX;
  long lVar4;
  Name nam;
  char *local_30;
  
  if (0 < (this->set).thenum) {
    lVar4 = 0;
    do {
      if (*(int *)(__filename + lVar4 * 4) < 0) {
        local_30 = this->mem + (this->set).theitem[(this->set).thekey[lVar4].idx].data;
        pcVar3 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                           (&this->hashtab,(char *)&local_30,in_EDX);
        in_EDX = extraout_EDX;
        if (-1 < (int)pcVar3) {
          *(states *)
           ((long)((this->hashtab).m_elem.data.
                   super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + ((ulong)pcVar3 & 0xffffffff)) + 0x10)
               = RELEASED;
          piVar1 = &(this->hashtab).m_used;
          *piVar1 = *piVar1 + -1;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->set).thenum);
  }
  iVar2 = DataSet<int>::remove(&this->set,__filename);
  return iVar2;
}

Assistant:

void NameSet::remove(int dstat[])
{
   for(int i = 0; i < set.num(); i++)
   {
      if(dstat[i] < 0)
      {
         const Name nam = &mem[set[i]];
         hashtab.remove(nam);
      }
   }

   set.remove(dstat);

   assert(isConsistent());
}